

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_elements_output_init_alloc
              (uchar *script,size_t script_len,uchar *asset,size_t asset_len,uchar *value,
              size_t value_len,uchar *nonce,size_t nonce_len,uchar *surjectionproof,
              size_t surjectionproof_len,uchar *rangeproof,size_t rangeproof_len,
              wally_tx_output **output)

{
  int iVar1;
  wally_tx_output *output_00;
  
  if (output == (wally_tx_output **)0x0) {
    iVar1 = -2;
  }
  else {
    *output = (wally_tx_output *)0x0;
    output_00 = (wally_tx_output *)wally_calloc(0x70);
    *output = output_00;
    if (output_00 == (wally_tx_output *)0x0) {
      iVar1 = -3;
    }
    else {
      iVar1 = tx_elements_output_init
                        (0xffffffffffffffff,script,script_len,asset,asset_len,value,value_len,nonce,
                         nonce_len,surjectionproof,surjectionproof_len,rangeproof,rangeproof_len,
                         output_00,true);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        clear_and_free(output_00,0x70);
        *output = (wally_tx_output *)0x0;
      }
    }
  }
  return iVar1;
}

Assistant:

int wally_tx_elements_output_init_alloc(
    const unsigned char *script,
    size_t script_len,
    const unsigned char *asset,
    size_t asset_len,
    const unsigned char *value,
    size_t value_len,
    const unsigned char *nonce,
    size_t nonce_len,
    const unsigned char *surjectionproof,
    size_t surjectionproof_len,
    const unsigned char *rangeproof,
    size_t rangeproof_len,
    struct wally_tx_output **output)
{
    struct wally_tx_output *result;
    int ret;

    TX_CHECK_OUTPUT;
    TX_OUTPUT_ALLOC(struct wally_tx_output);

    ret = tx_elements_output_init(-1, script, script_len,
                                  asset, asset_len,
                                  value, value_len,
                                  nonce, nonce_len,
                                  surjectionproof,
                                  surjectionproof_len,
                                  rangeproof, rangeproof_len,
                                  result, true);
    if (ret != WALLY_OK) {
        clear_and_free(result, sizeof(*result));
        *output = NULL;
    }
    return ret;
}